

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# db_test.cc
# Opt level: O0

bool leveldb::CompareIterators(int step,DB *model,DB *db,Snapshot *model_snap,Snapshot *db_snap)

{
  FILE *pFVar1;
  byte bVar2;
  int iVar3;
  uint uVar4;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined8 uVar5;
  undefined8 uVar6;
  undefined4 extraout_var_03;
  undefined4 extraout_var_04;
  undefined4 extraout_var_05;
  undefined4 extraout_var_06;
  undefined8 uVar7;
  Slice *value;
  Slice *value_00;
  Slice *value_01;
  Slice *value_02;
  Slice SVar8;
  byte local_189;
  undefined8 local_188 [2];
  string local_178;
  undefined8 local_158 [2];
  string local_148;
  undefined8 local_128 [2];
  string local_118;
  Slice local_f8;
  Slice local_e8;
  undefined1 local_d8 [16];
  string local_c8;
  undefined8 local_a8 [2];
  string local_98;
  Slice local_78;
  Slice local_68;
  uint local_58;
  byte local_51;
  int count;
  bool ok;
  Iterator *dbiter;
  Iterator *miter;
  ReadOptions options;
  Snapshot *db_snap_local;
  Snapshot *model_snap_local;
  DB *db_local;
  DB *model_local;
  int step_local;
  
  options.snapshot = db_snap;
  ReadOptions::ReadOptions((ReadOptions *)&miter);
  options._0_8_ = model_snap;
  iVar3 = (*model->_vptr_DB[6])(model,&miter);
  dbiter = (Iterator *)CONCAT44(extraout_var,iVar3);
  options._0_8_ = options.snapshot;
  iVar3 = (*db->_vptr_DB[6])(db,&miter);
  _count = (long *)CONCAT44(extraout_var_00,iVar3);
  local_51 = 1;
  local_58 = 0;
  (*dbiter->_vptr_Iterator[3])();
  (**(code **)(*_count + 0x18))();
  while( true ) {
    local_189 = 0;
    if ((local_51 & 1) != 0) {
      uVar4 = (*dbiter->_vptr_Iterator[2])();
      local_189 = 0;
      if ((uVar4 & 1) != 0) {
        local_189 = (**(code **)(*_count + 0x10))();
      }
    }
    if ((local_189 & 1) == 0) goto LAB_001368c2;
    local_58 = local_58 + 1;
    iVar3 = (*dbiter->_vptr_Iterator[8])();
    local_68.data_ = (char *)CONCAT44(extraout_var_01,iVar3);
    SVar8 = (Slice)(**(code **)(*_count + 0x40))();
    local_78 = SVar8;
    iVar3 = Slice::compare(&local_68,&local_78);
    pFVar1 = _stderr;
    if (iVar3 != 0) break;
    iVar3 = (*dbiter->_vptr_Iterator[9])();
    local_e8.data_ = (char *)CONCAT44(extraout_var_03,iVar3);
    SVar8 = (Slice)(**(code **)(*_count + 0x48))();
    local_f8 = SVar8;
    iVar3 = Slice::compare(&local_e8,&local_f8);
    pFVar1 = _stderr;
    if (iVar3 != 0) {
      iVar3 = (*dbiter->_vptr_Iterator[8])();
      local_128[0] = CONCAT44(extraout_var_04,iVar3);
      EscapeString_abi_cxx11_(&local_118,(leveldb *)local_128,value_00);
      uVar5 = std::__cxx11::string::c_str();
      iVar3 = (*dbiter->_vptr_Iterator[9])();
      local_158[0] = CONCAT44(extraout_var_05,iVar3);
      EscapeString_abi_cxx11_(&local_148,(leveldb *)local_158,value_01);
      uVar6 = std::__cxx11::string::c_str();
      iVar3 = (*dbiter->_vptr_Iterator[9])();
      local_188[0] = CONCAT44(extraout_var_06,iVar3);
      EscapeString_abi_cxx11_(&local_178,(leveldb *)local_188,value_02);
      uVar7 = std::__cxx11::string::c_str();
      fprintf(pFVar1,"step %d: Value mismatch for key \'%s\': \'%s\' vs. \'%s\'\n",(ulong)(uint)step
              ,uVar5,uVar6,uVar7);
      std::__cxx11::string::~string((string *)&local_178);
      std::__cxx11::string::~string((string *)&local_148);
      std::__cxx11::string::~string((string *)&local_118);
      local_51 = 0;
    }
    (*dbiter->_vptr_Iterator[6])();
    (**(code **)(*_count + 0x30))();
  }
  iVar3 = (*dbiter->_vptr_Iterator[8])();
  local_a8[0] = CONCAT44(extraout_var_02,iVar3);
  EscapeString_abi_cxx11_(&local_98,(leveldb *)local_a8,value);
  uVar5 = std::__cxx11::string::c_str();
  local_d8 = (**(code **)(*_count + 0x40))();
  EscapeString_abi_cxx11_(&local_c8,(leveldb *)local_d8,local_d8._8_8_);
  uVar6 = std::__cxx11::string::c_str();
  fprintf(pFVar1,"step %d: Key mismatch: \'%s\' vs. \'%s\'\n",(ulong)(uint)step,uVar5,uVar6);
  std::__cxx11::string::~string((string *)&local_c8);
  std::__cxx11::string::~string((string *)&local_98);
  local_51 = 0;
LAB_001368c2:
  if ((local_51 & 1) != 0) {
    iVar3 = (*dbiter->_vptr_Iterator[2])();
    bVar2 = (**(code **)(*_count + 0x10))();
    pFVar1 = _stderr;
    if (((byte)iVar3 & 1) != (bVar2 & 1)) {
      iVar3 = (*dbiter->_vptr_Iterator[2])();
      bVar2 = (**(code **)(*_count + 0x10))();
      fprintf(pFVar1,"step %d: Mismatch at end of iterators: %d vs. %d\n",(ulong)(uint)step,
              (ulong)((byte)iVar3 & 1),(ulong)(bVar2 & 1));
      local_51 = 0;
    }
  }
  fprintf(_stderr,"%d entries compared: ok=%d\n",(ulong)local_58,(ulong)(local_51 & 1));
  if (dbiter != (Iterator *)0x0) {
    (*dbiter->_vptr_Iterator[1])();
  }
  if (_count != (long *)0x0) {
    (**(code **)(*_count + 8))();
  }
  return (bool)(local_51 & 1);
}

Assistant:

static bool CompareIterators(int step, DB* model, DB* db,
                             const Snapshot* model_snap,
                             const Snapshot* db_snap) {
  ReadOptions options;
  options.snapshot = model_snap;
  Iterator* miter = model->NewIterator(options);
  options.snapshot = db_snap;
  Iterator* dbiter = db->NewIterator(options);
  bool ok = true;
  int count = 0;
  for (miter->SeekToFirst(), dbiter->SeekToFirst();
       ok && miter->Valid() && dbiter->Valid(); miter->Next(), dbiter->Next()) {
    count++;
    if (miter->key().compare(dbiter->key()) != 0) {
      std::fprintf(stderr, "step %d: Key mismatch: '%s' vs. '%s'\n", step,
                   EscapeString(miter->key()).c_str(),
                   EscapeString(dbiter->key()).c_str());
      ok = false;
      break;
    }

    if (miter->value().compare(dbiter->value()) != 0) {
      std::fprintf(stderr,
                   "step %d: Value mismatch for key '%s': '%s' vs. '%s'\n",
                   step, EscapeString(miter->key()).c_str(),
                   EscapeString(miter->value()).c_str(),
                   EscapeString(miter->value()).c_str());
      ok = false;
    }
  }

  if (ok) {
    if (miter->Valid() != dbiter->Valid()) {
      std::fprintf(stderr, "step %d: Mismatch at end of iterators: %d vs. %d\n",
                   step, miter->Valid(), dbiter->Valid());
      ok = false;
    }
  }
  std::fprintf(stderr, "%d entries compared: ok=%d\n", count, ok);
  delete miter;
  delete dbiter;
  return ok;
}